

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::one_thread::impl::disp_binder_t::unbind_agent
          (disp_binder_t *this,environment_t *env,agent_ref_t *agent_ref)

{
  agent_ref_t local_30;
  environment_t local_28;
  
  environment_t::query_named_dispatcher(&local_28,(string *)env);
  local_30 = (agent_ref_t)agent_ref->m_obj;
  agent_ref->m_obj = (agent_t *)0x0;
  unbind_agent_from_disp(this,(dispatcher_t *)local_28._vptr_environment_t,&local_30);
  intrusive_ptr_t<so_5::agent_t>::dismiss_object(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28.m_impl);
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & env,
			agent_ref_t agent_ref ) override
		{
			return unbind_agent_from_disp( 
				env.query_named_dispatcher( m_disp_name ).get(),
				std::move( agent_ref ) );
		}